

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-mem.c
# Opt level: O2

coda_dynamic_type * coda_mem_empty_record(coda_format format)

{
  uint __line;
  long lVar1;
  coda_type_record *definition;
  coda_mem_record *pcVar2;
  char *__assertion;
  
  if ((coda_format_rinex|coda_format_xml) < format) {
    __assertion = "format < num_empty_record_singletons";
    __line = 0x31;
LAB_0014782a:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem.c"
                  ,__line,"coda_dynamic_type *coda_mem_empty_record(coda_format)");
  }
  lVar1 = __tls_get_addr(&PTR_001d8d10);
  pcVar2 = *(coda_mem_record **)(lVar1 + 0x1060 + (ulong)format * 8);
  if (pcVar2 == (coda_mem_record *)0x0) {
    definition = coda_type_empty_record(format);
    pcVar2 = coda_mem_record_new(definition,(coda_dynamic_type *)0x0);
    *(coda_mem_record **)(lVar1 + 0x1060 + (ulong)format * 8) = pcVar2;
    if (pcVar2 == (coda_mem_record *)0x0) {
      __assertion = "empty_record_singleton[format] != NULL";
      __line = 0x35;
      goto LAB_0014782a;
    }
  }
  return (coda_dynamic_type *)pcVar2;
}

Assistant:

coda_dynamic_type *coda_mem_empty_record(coda_format format)
{
    assert(format < num_empty_record_singletons);
    if (empty_record_singleton[format] == NULL)
    {
        empty_record_singleton[format] = coda_mem_record_new(coda_type_empty_record(format), NULL);
        assert(empty_record_singleton[format] != NULL);
    }

    return (coda_dynamic_type *)empty_record_singleton[format];
}